

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O3

int WebPPictureAllocYUVA(WebPPicture *picture,int width,int height)

{
  WebPEncCSP WVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  long lVar5;
  WebPEncodingError error;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  WVar1 = picture->colorspace;
  WebPSafeFree(picture->memory_);
  picture->memory_ = (void *)0x0;
  picture->y = (uint8_t *)0x0;
  picture->u = (uint8_t *)0x0;
  picture->v = (uint8_t *)0x0;
  picture->y_stride = 0;
  picture->uv_stride = 0;
  *(undefined8 *)&picture->uv_stride = 0;
  *(undefined8 *)((long)&picture->a + 4) = 0;
  if ((WVar1 & WEBP_CSP_UV_MASK) == WEBP_YUV420) {
    lVar3 = (long)height;
    iVar7 = (int)((long)width + 1U >> 1);
    iVar2 = (int)(lVar3 + 1U >> 1);
    if (iVar2 < 1 || (iVar7 < 1 || (height < 1 || width < 1))) {
      error = VP8_ENC_ERROR_BAD_DIMENSION;
    }
    else {
      uVar8 = (int)(WVar1 << 0x1d) >> 0x1f & width;
      lVar6 = width * lVar3;
      lVar5 = (long)iVar2 * (long)iVar7;
      lVar3 = (int)uVar8 * lVar3;
      puVar4 = (uint8_t *)WebPSafeMalloc(lVar6 + lVar5 * 2 + lVar3,1);
      if (puVar4 != (uint8_t *)0x0) {
        picture->memory_ = puVar4;
        picture->y_stride = width;
        picture->uv_stride = iVar7;
        picture->a_stride = uVar8;
        picture->y = puVar4;
        puVar4 = puVar4 + lVar6;
        picture->u = puVar4;
        picture->v = puVar4 + lVar5;
        if (lVar3 != 0) {
          picture->a = puVar4 + lVar5 + lVar5;
        }
        return 1;
      }
      error = VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  else {
    error = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar2 = WebPEncodingSetError(picture,error);
  return iVar2;
}

Assistant:

int WebPPictureAllocYUVA(WebPPicture* const picture, int width, int height) {
  const WebPEncCSP uv_csp =
      (WebPEncCSP)((int)picture->colorspace & WEBP_CSP_UV_MASK);
  const int has_alpha = (int)picture->colorspace & WEBP_CSP_ALPHA_BIT;
  const int y_stride = width;
  const int uv_width = (int)(((int64_t)width + 1) >> 1);
  const int uv_height = (int)(((int64_t)height + 1) >> 1);
  const int uv_stride = uv_width;
  int a_width, a_stride;
  uint64_t y_size, uv_size, a_size, total_size;
  uint8_t* mem;

  assert(picture != NULL);

  WebPSafeFree(picture->memory_);
  WebPPictureResetBufferYUVA(picture);

  if (uv_csp != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }

  // alpha
  a_width = has_alpha ? width : 0;
  a_stride = a_width;
  y_size = (uint64_t)y_stride * height;
  uv_size = (uint64_t)uv_stride * uv_height;
  a_size =  (uint64_t)a_stride * height;

  total_size = y_size + a_size + 2 * uv_size;

  // Security and validation checks
  if (width <= 0 || height <= 0 ||           // luma/alpha param error
      uv_width <= 0 || uv_height <= 0) {     // u/v param error
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  mem = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*mem));
  if (mem == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // From now on, we're in the clear, we can no longer fail...
  picture->memory_ = (void*)mem;
  picture->y_stride  = y_stride;
  picture->uv_stride = uv_stride;
  picture->a_stride  = a_stride;

  // TODO(skal): we could align the y/u/v planes and adjust stride.
  picture->y = mem;
  mem += y_size;

  picture->u = mem;
  mem += uv_size;
  picture->v = mem;
  mem += uv_size;

  if (a_size > 0) {
    picture->a = mem;
    mem += a_size;
  }
  (void)mem;  // makes the static analyzer happy
  return 1;
}